

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

char * light_pcapng_to_string(light_pcapng pcapng)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint uVar5;
  char *__s;
  size_t sVar6;
  light_pcapng in_RDI;
  char *next;
  void *x_ret;
  char *offset;
  char *string;
  size_t buffer_size;
  uint32_t block_count;
  light_pcapng iter;
  _light_option *in_stack_ffffffffffffff88;
  char *local_38;
  light_pcapng local_18;
  char *local_8;
  
  if (in_RDI == (light_pcapng)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    uVar4 = light_get_block_count(in_RDI);
    local_8 = (char *)calloc((ulong)(uVar4 << 7),1);
    local_38 = local_8;
    local_18 = in_RDI;
    if (local_8 == (char *)0x0) {
      fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
              ,"light_pcapng_to_string",0x13e);
      local_8 = (char *)0x0;
    }
    else {
      for (; local_18 != (light_pcapng)0x0; local_18 = local_18->next_block) {
        __s = (char *)calloc(0x80,1);
        uVar1 = local_18->block_type;
        uVar2 = local_18->block_total_lenght;
        puVar3 = local_18->block_body;
        uVar5 = __option_count(in_stack_ffffffffffffff88);
        sprintf(__s,"---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
                (ulong)uVar1,(ulong)uVar2,puVar3,(ulong)uVar5);
        sVar6 = strlen(__s);
        memcpy(local_38,__s,sVar6);
        sVar6 = strlen(__s);
        free(__s);
        local_38 = local_38 + sVar6;
      }
    }
  }
  return local_8;
}

Assistant:

char *light_pcapng_to_string(light_pcapng pcapng)
{
	if (pcapng == NULL)
		return NULL;

	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	size_t buffer_size = 128 * block_count;
	char *string = calloc(buffer_size, sizeof(char));
	char *offset = string;
	DCHECK_NULLP(offset, return NULL);

	while (iter != NULL) {
		char *next = calloc(128, 1);

		sprintf(next, "---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
				iter->block_type, iter->block_total_lenght, (void*)iter->block_body, __option_count(iter->options));

		memcpy(offset, next, strlen(next));
		offset += strlen(next);
		free(next);
		iter = iter->next_block;
	}

	return string;
}